

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O0

int Hop_ObjRecognizeExor(Hop_Obj_t *pObj,Hop_Obj_t **ppFan0,Hop_Obj_t **ppFan1)

{
  int iVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *pHVar5;
  Hop_Obj_t *pHVar6;
  Hop_Obj_t *p1;
  Hop_Obj_t *p0;
  Hop_Obj_t **ppFan1_local;
  Hop_Obj_t **ppFan0_local;
  Hop_Obj_t *pObj_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopUtil.c"
                  ,0xbe,"int Hop_ObjRecognizeExor(Hop_Obj_t *, Hop_Obj_t **, Hop_Obj_t **)");
  }
  iVar1 = Hop_ObjIsNode(pObj);
  if (iVar1 == 0) {
    pObj_local._4_4_ = 0;
  }
  else {
    iVar1 = Hop_ObjIsExor(pObj);
    if (iVar1 == 0) {
      iVar1 = Hop_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Hop_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopUtil.c"
                      ,199,"int Hop_ObjRecognizeExor(Hop_Obj_t *, Hop_Obj_t **, Hop_Obj_t **)");
      }
      pHVar3 = Hop_ObjChild0(pObj);
      pHVar4 = Hop_ObjChild1(pObj);
      iVar1 = Hop_IsComplement(pHVar3);
      if ((iVar1 != 0) && (iVar1 = Hop_IsComplement(pHVar4), iVar1 != 0)) {
        pHVar3 = Hop_Regular(pHVar3);
        pHVar4 = Hop_Regular(pHVar4);
        iVar1 = Hop_ObjIsAnd(pHVar3);
        if ((iVar1 != 0) && (iVar1 = Hop_ObjIsAnd(pHVar4), iVar1 != 0)) {
          pHVar5 = Hop_ObjFanin0(pHVar3);
          pHVar6 = Hop_ObjFanin0(pHVar4);
          if (pHVar5 == pHVar6) {
            pHVar5 = Hop_ObjFanin1(pHVar3);
            pHVar6 = Hop_ObjFanin1(pHVar4);
            if (pHVar5 == pHVar6) {
              iVar1 = Hop_ObjFaninC0(pHVar3);
              iVar2 = Hop_ObjFaninC0(pHVar4);
              if (iVar1 != iVar2) {
                iVar1 = Hop_ObjFaninC1(pHVar3);
                iVar2 = Hop_ObjFaninC1(pHVar4);
                if (iVar1 != iVar2) {
                  pHVar4 = Hop_ObjChild0(pHVar3);
                  *ppFan0 = pHVar4;
                  pHVar3 = Hop_ObjChild1(pHVar3);
                  *ppFan1 = pHVar3;
                  return 1;
                }
              }
              return 0;
            }
          }
          return 0;
        }
        return 0;
      }
      pObj_local._4_4_ = 0;
    }
    else {
      pHVar3 = Hop_ObjChild0(pObj);
      *ppFan0 = pHVar3;
      pHVar3 = Hop_ObjChild1(pObj);
      *ppFan1 = pHVar3;
      pObj_local._4_4_ = 1;
    }
  }
  return pObj_local._4_4_;
}

Assistant:

int Hop_ObjRecognizeExor( Hop_Obj_t * pObj, Hop_Obj_t ** ppFan0, Hop_Obj_t ** ppFan1 )
{
    Hop_Obj_t * p0, * p1;
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) )
        return 0;
    if ( Hop_ObjIsExor(pObj) )
    {
        *ppFan0 = Hop_ObjChild0(pObj);
        *ppFan1 = Hop_ObjChild1(pObj);
        return 1;
    }
    assert( Hop_ObjIsAnd(pObj) );
    p0 = Hop_ObjChild0(pObj);
    p1 = Hop_ObjChild1(pObj);
    if ( !Hop_IsComplement(p0) || !Hop_IsComplement(p1) )
        return 0;
    p0 = Hop_Regular(p0);
    p1 = Hop_Regular(p1);
    if ( !Hop_ObjIsAnd(p0) || !Hop_ObjIsAnd(p1) )
        return 0;
    if ( Hop_ObjFanin0(p0) != Hop_ObjFanin0(p1) || Hop_ObjFanin1(p0) != Hop_ObjFanin1(p1) )
        return 0;
    if ( Hop_ObjFaninC0(p0) == Hop_ObjFaninC0(p1) || Hop_ObjFaninC1(p0) == Hop_ObjFaninC1(p1) )
        return 0;
    *ppFan0 = Hop_ObjChild0(p0);
    *ppFan1 = Hop_ObjChild1(p0);
    return 1;
}